

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::SharedDtor(FieldOptions *this)

{
  string *this_00;
  
  this_00 = this->experimental_map_key_;
  if (this_00 != (string *)&internal::kEmptyString_abi_cxx11_) {
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x20);
    return;
  }
  return;
}

Assistant:

void FieldOptions::SharedDtor() {
  if (experimental_map_key_ != &::google::protobuf::internal::kEmptyString) {
    delete experimental_map_key_;
  }
  if (this != default_instance_) {
  }
}